

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.cpp
# Opt level: O0

bool test_SSTable_behavior(void)

{
  allocator<SSTableDataEntry> *this;
  initializer_list<SSTableDataEntry> __l;
  SSTableHeader *pSVar1;
  SSTableIndex *this_00;
  reference pvVar2;
  SSTableDataEntry *local_1b8;
  SSTableIndex *index;
  SSTableHeader *h;
  SSTable s;
  SSTableDataEntry local_138;
  SSTableDataEntry local_f8;
  SSTableDataEntry local_b8;
  SSTableDataEntry local_78;
  iterator local_38;
  size_type local_30;
  undefined1 local_28 [8];
  SSTableData data;
  
  SSTableDataEntry::SSTableDataEntry(&local_138,false,0xbc614e,1,"Hello,World!");
  SSTableDataEntry::SSTableDataEntry(&local_f8,false,0x75bc702,2,"LLLLL");
  SSTableDataEntry::SSTableDataEntry(&local_b8,true,0x4840e3f3,3,"");
  SSTableDataEntry::SSTableDataEntry(&local_78,false,0x75998cb,4,"NIMO");
  local_38 = &local_138;
  local_30 = 4;
  this = (allocator<SSTableDataEntry> *)((long)&s.index + 3);
  std::allocator<SSTableDataEntry>::allocator(this);
  __l._M_len = local_30;
  __l._M_array = local_38;
  std::vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>::vector
            ((vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_> *)local_28,__l,this);
  std::allocator<SSTableDataEntry>::~allocator((allocator<SSTableDataEntry> *)((long)&s.index + 3));
  local_1b8 = (SSTableDataEntry *)&local_38;
  do {
    local_1b8 = local_1b8 + -1;
    SSTableDataEntry::~SSTableDataEntry(local_1b8);
  } while (local_1b8 != &local_138);
  SSTable::SSTable((SSTable *)&h);
  SSTable::fillData((SSTable *)&h,(SSTableData *)local_28);
  pSVar1 = SSTable::getHeader((SSTable *)&h);
  if ((((pSVar1->key_min == 1) && (pSVar1->entries_count == 4)) && (pSVar1->key_max == 4)) &&
     (pSVar1->index_offset == 0x99)) {
    this_00 = SSTable::getIndex((SSTable *)&h);
    pvVar2 = std::vector<SSTableIndexItem,_std::allocator<SSTableIndexItem>_>::operator[](this_00,0)
    ;
    if (pvVar2->key == 1) {
      pvVar2 = std::vector<SSTableIndexItem,_std::allocator<SSTableIndexItem>_>::operator[]
                         (this_00,0);
      if (pvVar2->offset == 0x20) {
        pvVar2 = std::vector<SSTableIndexItem,_std::allocator<SSTableIndexItem>_>::operator[]
                           (this_00,1);
        if (pvVar2->key == 2) {
          pvVar2 = std::vector<SSTableIndexItem,_std::allocator<SSTableIndexItem>_>::operator[]
                             (this_00,1);
          if (pvVar2->offset == 0x45) {
            pvVar2 = std::vector<SSTableIndexItem,_std::allocator<SSTableIndexItem>_>::operator[]
                               (this_00,2);
            if (pvVar2->key == 3) {
              pvVar2 = std::vector<SSTableIndexItem,_std::allocator<SSTableIndexItem>_>::operator[]
                                 (this_00,2);
              if (pvVar2->offset == 99) {
                pvVar2 = std::vector<SSTableIndexItem,_std::allocator<SSTableIndexItem>_>::
                         operator[](this_00,3);
                if (pvVar2->key == 4) {
                  pvVar2 = std::vector<SSTableIndexItem,_std::allocator<SSTableIndexItem>_>::
                           operator[](this_00,3);
                  if (pvVar2->offset == 0x7c) {
                    data.super__Vector_base<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = 1;
                    goto LAB_001055d5;
                  }
                }
              }
            }
          }
        }
      }
    }
    data.super__Vector_base<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._7_1_ = 0;
  }
  else {
    data.super__Vector_base<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._7_1_ = 0;
  }
LAB_001055d5:
  SSTable::~SSTable((SSTable *)&h);
  std::vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>::~vector
            ((vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_> *)local_28);
  return (bool)(data.super__Vector_base<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>._M_impl
                .super__Vector_impl_data._M_end_of_storage._7_1_ & 1);
}

Assistant:

bool test_SSTable_behavior() {
    auto data = SSTableData{
            {false, 12345678,   1, "Hello,World!"},
            {false, 123455234,  2, "LLLLL"},
            {true,  1212212211, 3, ""},
            {false, 123312331,  4, "NIMO"}
    };
    auto s = SSTable{};
    s.fillData(data);

    auto *h = s.getHeader();

    if (h->key_min != 1 || h->entries_count != 4 || h->key_max != 4 || h->index_offset != 32 + (25 * 4 + 12 + 5 + 4)) {
        return false;
    }

    auto &index = *s.getIndex();

    if (
            index[0].key != 1 ||
            index[0].offset != 32 ||
            index[1].key != 2 ||
            index[1].offset != 69 ||
            index[2].key != 3 ||
            index[2].offset != 99 ||
            index[3].key != 4 ||
            index[3].offset != 124
            ) {
        return false;
    }

    return true;
}